

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

void icu_63::CalendarCache::createCache(CalendarCache **cache,UErrorCode *status)

{
  CalendarCache *pCVar1;
  UHashtable *pUVar2;
  code *size;
  
  size = calendar_astro_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_ASTRO_CALENDAR,calendar_astro_cleanup);
  if (cache == (CalendarCache **)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    pCVar1 = (CalendarCache *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
    if (pCVar1 == (CalendarCache *)0x0) {
      pCVar1 = (CalendarCache *)0x0;
    }
    else {
      pCVar1->_vptr_CalendarCache = (_func_int **)&PTR__CalendarCache_003d63e8;
      pUVar2 = uhash_openSize_63(uhash_hashLong_63,uhash_compareLong_63,(undefined1 *)0x0,0x20,
                                 status);
      pCVar1->fTable = pUVar2;
    }
    *cache = pCVar1;
    if (U_ZERO_ERROR < *status) {
      if (pCVar1 != (CalendarCache *)0x0) {
        (*pCVar1->_vptr_CalendarCache[1])(pCVar1);
      }
      *cache = (CalendarCache *)0x0;
    }
  }
  return;
}

Assistant:

void CalendarCache::createCache(CalendarCache** cache, UErrorCode& status) {
    ucln_i18n_registerCleanup(UCLN_I18N_ASTRO_CALENDAR, calendar_astro_cleanup);
    if(cache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        *cache = new CalendarCache(32, status);
        if(U_FAILURE(status)) {
            delete *cache;
            *cache = NULL;
        }
    }
}